

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderFloatAttribute(ImfHeader *hdr,char *name,float *value)

{
  TypedAttribute<float> *this;
  float *pfVar1;
  Header *in_RDX;
  ImfHeader *in_RDI;
  exception *e;
  char *in_stack_ffffffffffffffd8;
  
  anon_unknown.dwarf_572a3::header(in_RDI);
  this = Imf_3_2::Header::typedAttribute<Imf_3_2::TypedAttribute<float>>
                   (in_RDX,in_stack_ffffffffffffffd8);
  pfVar1 = Imf_3_2::TypedAttribute<float>::value(this);
  *(float *)&(in_RDX->_map)._M_t._M_impl = *pfVar1;
  return 1;
}

Assistant:

int
ImfHeaderFloatAttribute (const ImfHeader* hdr, const char name[], float* value)
{
    try
    {
        *value = header (hdr)
                     ->typedAttribute<
                         OPENEXR_IMF_INTERNAL_NAMESPACE::FloatAttribute> (name)
                     .value ();
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}